

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitreader_buffer.c
# Opt level: O1

uint32_t aom_rb_read_uvlc(aom_read_bit_buffer *rb)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint32_t uVar4;
  int leading_zeros;
  int iVar5;
  
  iVar5 = 0;
  do {
    iVar1 = aom_rb_read_bit(rb);
    if (iVar1 != 0) goto LAB_001607cf;
    iVar5 = iVar5 + 1;
  } while (iVar5 != 0x20);
  iVar5 = 0x20;
LAB_001607cf:
  uVar4 = 0xffffffff;
  if (iVar5 != 0x20) {
    if (iVar5 == 0) {
      uVar3 = 0;
    }
    else {
      iVar1 = iVar5 + 1;
      uVar3 = 0;
      do {
        iVar2 = aom_rb_read_bit(rb);
        uVar3 = uVar3 | iVar2 << ((char)iVar1 - 2U & 0x1f);
        iVar1 = iVar1 + -1;
      } while (1 < iVar1);
    }
    uVar4 = uVar3 + ~(-1 << ((byte)iVar5 & 0x1f));
  }
  return uVar4;
}

Assistant:

uint32_t aom_rb_read_uvlc(struct aom_read_bit_buffer *rb) {
  int leading_zeros = 0;
  while (leading_zeros < 32 && !aom_rb_read_bit(rb)) ++leading_zeros;
  // Maximum 32 bits.
  if (leading_zeros == 32) return UINT32_MAX;
  const uint32_t base = (1u << leading_zeros) - 1;
  const uint32_t value = aom_rb_read_literal(rb, leading_zeros);
  return base + value;
}